

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O2

char * cJSONUtils_FindPointerFromObjectTo(cJSON *object,cJSON *target)

{
  int iVar1;
  char *__s;
  uchar *puVar2;
  size_t sVar3;
  char *__dest;
  size_t sVar4;
  long lVar5;
  cJSON *object_00;
  
  if (target != (cJSON *)0x0 && object != (cJSON *)0x0) {
    if (object == target) {
      puVar2 = cJSONUtils_strdup("");
      return (char *)puVar2;
    }
    object_00 = (cJSON *)&object->child;
    lVar5 = 0;
    while (object_00 = object_00->next, object_00 != (cJSON *)0x0) {
      __s = cJSONUtils_FindPointerFromObjectTo(object_00,target);
      if (__s != (char *)0x0) {
        iVar1 = cJSON_IsArray(object);
        if (iVar1 == 0) {
          iVar1 = cJSON_IsObject(object);
          if (iVar1 == 0) {
            cJSON_free(__s);
            return (char *)0x0;
          }
          sVar3 = strlen(__s);
          sVar4 = pointer_encoded_length((uchar *)object_00->string);
          __dest = (char *)cJSON_malloc(sVar3 + sVar4 + 2);
          *__dest = '/';
          encode_string_as_pointer((uchar *)(__dest + 1),(uchar *)object_00->string);
          strcat(__dest,__s);
        }
        else {
          sVar3 = strlen(__s);
          __dest = (char *)cJSON_malloc(sVar3 + 0x16);
          sprintf(__dest,"/%lu%s",lVar5,__s);
        }
        cJSON_free(__s);
        return __dest;
      }
      lVar5 = lVar5 + 1;
    }
  }
  return (char *)0x0;
}

Assistant:

CJSON_PUBLIC(char *) cJSONUtils_FindPointerFromObjectTo(const cJSON * const object, const cJSON * const target)
{
    size_t child_index = 0;
    cJSON *current_child = 0;

    if ((object == NULL) || (target == NULL))
    {
        return NULL;
    }

    if (object == target)
    {
        /* found */
        return (char*)cJSONUtils_strdup((const unsigned char*)"");
    }

    /* recursively search all children of the object or array */
    for (current_child = object->child; current_child != NULL; (void)(current_child = current_child->next), child_index++)
    {
        unsigned char *target_pointer = (unsigned char*)cJSONUtils_FindPointerFromObjectTo(current_child, target);
        /* found the target? */
        if (target_pointer != NULL)
        {
            if (cJSON_IsArray(object))
            {
                /* reserve enough memory for a 64 bit integer + '/' and '\0' */
                unsigned char *full_pointer = (unsigned char*)cJSON_malloc(strlen((char*)target_pointer) + 20 + sizeof("/"));
                /* check if conversion to unsigned long is valid
                 * This should be eliminated at compile time by dead code elimination
                 * if size_t is an alias of unsigned long, or if it is bigger */
                if (child_index > ULONG_MAX)
                {
                    cJSON_free(target_pointer);
                    cJSON_free(full_pointer);
                    return NULL;
                }
                sprintf((char*)full_pointer, "/%lu%s", (unsigned long)child_index, target_pointer); /* /<array_index><path> */
                cJSON_free(target_pointer);

                return (char*)full_pointer;
            }

            if (cJSON_IsObject(object))
            {
                unsigned char *full_pointer = (unsigned char*)cJSON_malloc(strlen((char*)target_pointer) + pointer_encoded_length((unsigned char*)current_child->string) + 2);
                full_pointer[0] = '/';
                encode_string_as_pointer(full_pointer + 1, (unsigned char*)current_child->string);
                strcat((char*)full_pointer, (char*)target_pointer);
                cJSON_free(target_pointer);

                return (char*)full_pointer;
            }

            /* reached leaf of the tree, found nothing */
            cJSON_free(target_pointer);
            return NULL;
        }
    }

    /* not found */
    return NULL;
}